

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void * __thiscall
vector<vector<vector<int>_>_>::realloc
          (vector<vector<vector<int>_>_> *this,void *__ptr,size_t __size)

{
  vector<vector<int>_> *pvVar1;
  uint uVar2;
  void *in_RAX;
  ulong *puVar3;
  void *extraout_RAX;
  long lVar4;
  long lVar5;
  int i;
  vector<vector<int>_> *pvVar6;
  
  uVar2 = 1;
  if (1 < (int)(uint)__ptr) {
    uVar2 = (uint)__ptr;
  }
  if (this->_capacity != uVar2) {
    lVar5 = (ulong)uVar2 * 0x10;
    puVar3 = (ulong *)operator_new__(lVar5 + 8);
    *puVar3 = (ulong)uVar2;
    pvVar1 = (vector<vector<int>_> *)(puVar3 + 1);
    lVar4 = 0;
    pvVar6 = pvVar1;
    do {
      vector<vector<int>_>::vector(pvVar6);
      lVar4 = lVar4 + -0x10;
      pvVar6 = pvVar6 + 1;
    } while (-lVar4 != lVar5);
    lVar4 = 0;
    for (lVar5 = 0; in_RAX = (void *)(long)this->_size, lVar5 < (long)in_RAX; lVar5 = lVar5 + 1) {
      vector<vector<int>_>::operator=
                ((vector<vector<int>_> *)((long)&pvVar1->vect + lVar4),
                 (vector<vector<int>_> *)((long)&this->vect->vect + lVar4));
      lVar4 = lVar4 + 0x10;
    }
    this->_capacity = uVar2;
    pvVar6 = this->vect;
    if (pvVar6 != (vector<vector<int>_> *)0x0) {
      lVar4._0_4_ = pvVar6[-1]._size;
      lVar4._4_4_ = pvVar6[-1]._capacity;
      if (lVar4 != 0) {
        lVar4 = lVar4 << 4;
        do {
          vector<vector<int>_>::~vector((vector<vector<int>_> *)((long)&pvVar6[-1].vect + lVar4));
          lVar4 = lVar4 + -0x10;
        } while (lVar4 != 0);
      }
      operator_delete__(&pvVar6[-1]._size);
      in_RAX = extraout_RAX;
    }
    this->vect = pvVar1;
  }
  return in_RAX;
}

Assistant:

inline T max(const T& a, const T& b) {
    return (a < b) ? b : a;
}